

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

Column * Catch::TextFlow::Spacer(Column *__return_storage_ptr__,size_t spaceWidth)

{
  allocator<char> local_41;
  string local_40;
  undefined1 local_19;
  size_t local_18;
  size_t spaceWidth_local;
  Column *ret;
  
  local_19 = 0;
  local_18 = spaceWidth;
  spaceWidth_local = (size_t)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  Column::Column(__return_storage_ptr__,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  Column::width(__return_storage_ptr__,local_18);
  return __return_storage_ptr__;
}

Assistant:

Column Spacer( size_t spaceWidth ) {
            Column ret{ "" };
            ret.width( spaceWidth );
            return ret;
        }